

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O2

void re2::SearchAltMatch(int iters,int nbytes,SearchImpl *search)

{
  string s;
  StringPiece local_28;
  
  StopBenchmarkTiming();
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  MakeText(&s,nbytes);
  BenchmarkMemoryUsage();
  StartBenchmarkTiming();
  local_28.ptr_ = s._M_dataplus._M_p;
  local_28.length_ = (int)s._M_string_length;
  (*search)(iters,"\\C*",&local_28,kAnchored,true);
  SetBenchmarkBytesProcessed((long)nbytes * (long)iters);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void SearchAltMatch(int iters, int nbytes, SearchImpl* search) {
  StopBenchmarkTiming();
  string s;
  MakeText(&s, nbytes);
  BenchmarkMemoryUsage();
  StartBenchmarkTiming();
  search(iters, "\\C*", s, Prog::kAnchored, true);
  SetBenchmarkBytesProcessed(static_cast<int64>(iters)*nbytes);
}